

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O1

void __thiscall
MxxColl_AllgathervGeneral_Test::~MxxColl_AllgathervGeneral_Test
          (MxxColl_AllgathervGeneral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, AllgathervGeneral) {
    mxx::comm c;
    std::vector<size_t> recv_sizes;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    // prepare recv sizes and output vector
    std::vector<int> all;
    size_t total_size = 0;
    recv_sizes.resize(c.size());
    for (int i = 0; i < c.size(); ++i) {
        recv_sizes[i] = 5*(i+2);
        total_size += recv_sizes[i];
    }
    all.resize(total_size);

    // general gatherv
    mxx::allgatherv(&els[0], size, &all[0], recv_sizes, c);
    size_t pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience functions
    all = mxx::allgatherv(&els[0], size, recv_sizes, c);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience functions
    all = mxx::allgatherv(els, recv_sizes);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
}